

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O2

bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *context,BasicBlock *block)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Function *in_RAX;
  CFG *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  FeatureManager *pFVar8;
  Instruction *pIVar9;
  StructuredCFGAnalysis *this_00;
  DefUseManager *this_01;
  Instruction *pIVar10;
  BasicBlock *pBVar11;
  uint32_t i;
  uint index;
  Function *local_38;
  
  pIVar9 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if (pIVar9->opcode_ == OpBranch) {
    local_38 = in_RAX;
    uVar4 = Instruction::GetSingleWordInOperand(pIVar9,0);
    this = IRContext::cfg(context);
    pvVar7 = CFG::preds(this,uVar4);
    if ((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start != 4) {
      return false;
    }
    uVar5 = BasicBlock::id(block);
    bVar1 = anon_unknown_0::IsMerge(context,uVar5);
    bVar2 = anon_unknown_0::IsMerge(context,uVar4);
    if (!bVar1 || !bVar2) {
      if (bVar2) {
        pFVar8 = IRContext::get_feature_mgr(context);
        bVar3 = EnumSet<spvtools::Extension>::contains
                          (&pFVar8->extensions_,kSPV_KHR_maximal_reconvergence);
        if (bVar3) {
          return false;
        }
      }
      if ((!bVar1) || (bVar1 = anon_unknown_0::IsContinue(context,uVar4), !bVar1)) {
        pIVar9 = BasicBlock::GetMergeInst(block);
        bVar1 = anon_unknown_0::IsHeader(block);
        if ((!bVar1) || (uVar5 = Instruction::GetSingleWordInOperand(pIVar9,0), uVar4 == uVar5)) {
LAB_00487809:
          if ((!bVar2) && (bVar1 = anon_unknown_0::IsContinue(context,uVar4), !bVar1)) {
            return true;
          }
          this_00 = IRContext::GetStructuredCFGAnalysis(context);
          uVar4 = BasicBlock::id(block);
          uVar4 = StructuredCFGAnalysis::ContainingSwitch(this_00,uVar4);
          if (uVar4 == 0) {
            return true;
          }
          uVar5 = StructuredCFGAnalysis::SwitchMergeBlock(this_00,uVar4);
          opt::Function::FindBlock(block->function_,uVar4);
          BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffc8);
          index = 1;
          do {
            uVar4 = Instruction::NumInOperands((Instruction *)local_38);
            bVar1 = uVar4 <= index;
            if (bVar1) {
              return bVar1;
            }
            uVar4 = Instruction::GetSingleWordInOperand((Instruction *)local_38,index);
            uVar6 = BasicBlock::id(block);
            index = index + 2;
          } while ((uVar4 == uVar5) || (uVar4 != uVar6));
          return bVar1;
        }
        this_01 = IRContext::get_def_use_mgr(context);
        pIVar10 = analysis::DefUseManager::GetDef(this_01,uVar4);
        pBVar11 = IRContext::get_instr_block(context,pIVar10);
        bVar1 = anon_unknown_0::IsHeader(pBVar11);
        if (!bVar1) {
          pBVar11 = IRContext::get_instr_block(context,uVar4);
          pIVar10 = BasicBlock::terminator(pBVar11);
          if (pIVar9->opcode_ != OpLoopMerge) {
            __assert_fail("merge_inst->opcode() == spv::Op::OpLoopMerge",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp"
                          ,0x86,
                          "bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *, BasicBlock *)"
                         );
          }
          if (pIVar10->opcode_ - OpBranch < 2) goto LAB_00487809;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CanMergeWithSuccessor(IRContext* context, BasicBlock* block) {
  // Find block with single successor which has no other predecessors.
  auto ii = block->end();
  --ii;
  Instruction* br = &*ii;
  if (br->opcode() != spv::Op::OpBranch) {
    return false;
  }

  const uint32_t lab_id = br->GetSingleWordInOperand(0);
  if (context->cfg()->preds(lab_id).size() != 1) {
    return false;
  }

  bool pred_is_merge = IsMerge(context, block);
  bool succ_is_merge = IsMerge(context, lab_id);
  if (pred_is_merge && succ_is_merge) {
    // Cannot merge two merges together.
    return false;
  }

  // Note: This means that the instructions in a break block will execute as if
  // they were still diverged according to the loop iteration. This restricts
  // potential transformations an implementation may perform on the IR to match
  // shader author expectations. Similarly, instructions in the loop construct
  // cannot be moved into the continue construct unless it can be proven that
  // invocations are always converged.
  if (succ_is_merge && context->get_feature_mgr()->HasExtension(
                           kSPV_KHR_maximal_reconvergence)) {
    return false;
  }

  if (pred_is_merge && IsContinue(context, lab_id)) {
    // Cannot merge a continue target with a merge block.
    return false;
  }

  Instruction* merge_inst = block->GetMergeInst();
  const bool pred_is_header = IsHeader(block);
  if (pred_is_header && lab_id != merge_inst->GetSingleWordInOperand(0u)) {
    bool succ_is_header = IsHeader(context, lab_id);
    if (pred_is_header && succ_is_header) {
      // Cannot merge two headers together when the successor is not the merge
      // block of the predecessor.
      return false;
    }

    // If this is a header block and the successor is not its merge, we must
    // be careful about which blocks we are willing to merge together.
    // OpLoopMerge must be followed by a conditional or unconditional branch.
    // The merge must be a loop merge because a selection merge cannot be
    // followed by an unconditional branch.
    BasicBlock* succ_block = context->get_instr_block(lab_id);
    spv::Op succ_term_op = succ_block->terminator()->opcode();
    assert(merge_inst->opcode() == spv::Op::OpLoopMerge);
    if (succ_term_op != spv::Op::OpBranch &&
        succ_term_op != spv::Op::OpBranchConditional) {
      return false;
    }
  }

  if (succ_is_merge || IsContinue(context, lab_id)) {
    auto* struct_cfg = context->GetStructuredCFGAnalysis();
    auto switch_block_id = struct_cfg->ContainingSwitch(block->id());
    if (switch_block_id) {
      auto switch_merge_id = struct_cfg->SwitchMergeBlock(switch_block_id);
      const auto* switch_inst =
          &*block->GetParent()->FindBlock(switch_block_id)->tail();
      for (uint32_t i = 1; i < switch_inst->NumInOperands(); i += 2) {
        auto target_id = switch_inst->GetSingleWordInOperand(i);
        if (target_id == block->id() && target_id != switch_merge_id) {
          // Case constructs must be structurally dominated by the OpSwitch.
          // Since the successor is the merge/continue for another construct,
          // merging the blocks would break that requirement.
          return false;
        }
      }
    }
  }

  return true;
}